

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

string * duckdb::StrTimeFormat::ParseFormatSpecifier
                   (string *__return_storage_ptr__,string *format_string,StrTimeFormat *format)

{
  char cVar1;
  pointer pSVar2;
  pointer piVar3;
  ulong uVar4;
  size_type sVar5;
  byte bVar6;
  reference pvVar7;
  reference pvVar8;
  InternalException *this;
  ulong uVar9;
  ulong uVar10;
  pointer pcVar11;
  ulong uVar12;
  allocator local_211;
  string current_literal;
  string subformat;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string error;
  StrfTimeFormat locale_format;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (format_string->_M_string_length == 0) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Empty format string",(allocator *)&locale_format);
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&format->format_specifier);
    pSVar2 = (format->specifiers).
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((format->specifiers).
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar2) {
      (format->specifiers).
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar2;
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(format->literals).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    piVar3 = (format->numeric_width).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((format->numeric_width).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar3) {
      (format->numeric_width).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar3;
    }
    format->constant_size = 0;
    current_literal._M_dataplus._M_p = (pointer)&current_literal.field_2;
    current_literal._M_string_length = 0;
    current_literal.field_2._M_allocated_capacity._0_4_ =
         current_literal.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    uVar10 = 0;
    uVar12 = 0;
    while (uVar4 = format_string->_M_string_length, uVar12 < uVar4) {
      pcVar11 = (format_string->_M_dataplus)._M_p;
      uVar9 = uVar12;
      if (pcVar11[uVar12] != '%') goto LAB_0155c73d;
      uVar9 = uVar12 + 1;
      if (uVar9 == uVar4) {
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"Trailing format character %",
                   (allocator *)&locale_format);
        goto LAB_0155c82d;
      }
      if (uVar10 < uVar12) {
        ::std::__cxx11::string::substr((ulong)&locale_format,(ulong)format_string);
        ::std::__cxx11::string::append((string *)&current_literal);
        ::std::__cxx11::string::~string((string *)&locale_format);
        pcVar11 = (format_string->_M_dataplus)._M_p;
      }
      sVar5 = current_literal._M_string_length;
      cVar1 = pcVar11[uVar9];
      switch(cVar1) {
      case 'A':
        bVar6 = 1;
        break;
      case 'B':
        bVar6 = 6;
        break;
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'J':
      case 'K':
      case 'L':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case '[':
      case '\\':
      case ']':
      case '^':
      case '_':
      case '`':
      case 'e':
      case 'i':
      case 'k':
      case 'l':
      case 'o':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'v':
switchD_0155c38b_caseD_43:
        locale_format.super_StrTimeFormat._vptr_StrTimeFormat =
             (_func_int **)&locale_format.super_StrTimeFormat.format_specifier._M_string_length;
        ::std::__cxx11::string::_M_construct((ulong)&locale_format,'\x01');
        ::std::operator+(__return_storage_ptr__,"Unrecognized format for strftime/strptime: %",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &locale_format);
LAB_0155c887:
        ::std::__cxx11::string::~string((string *)&locale_format);
        goto LAB_0155c82d;
      case 'G':
        bVar6 = 0x21;
        break;
      case 'H':
        bVar6 = 0xc;
        break;
      case 'I':
        bVar6 = 0xe;
        break;
      case 'M':
        bVar6 = 0x11;
        break;
      case 'S':
        bVar6 = 0x13;
        break;
      case 'T':
      case 'X':
      case 'c':
      case 'x':
        subformat._M_dataplus._M_p = (pointer)&subformat.field_2;
        subformat._M_string_length = 0;
        subformat.field_2._M_local_buf[0] = '\0';
        if ((((cVar1 == 'T') || (cVar1 == 'X')) || (cVar1 == 'x')) || (cVar1 == 'c')) {
          ::std::__cxx11::string::assign((char *)&subformat);
        }
        locale_format.super_StrTimeFormat.format_specifier._M_dataplus._M_p =
             (pointer)&locale_format.super_StrTimeFormat.format_specifier.field_2;
        locale_format.super_StrTimeFormat.format_specifier._M_string_length = 0;
        locale_format.super_StrTimeFormat.format_specifier.field_2._M_local_buf[0] = '\0';
        locale_format.super_StrTimeFormat.numeric_width.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        locale_format.super_StrTimeFormat.numeric_width.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        locale_format.super_StrTimeFormat.constant_size = 0;
        locale_format.super_StrTimeFormat.numeric_width.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        locale_format.super_StrTimeFormat.literals.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        locale_format.super_StrTimeFormat.literals.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        locale_format.super_StrTimeFormat.specifiers.
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        locale_format.super_StrTimeFormat.literals.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        locale_format.super_StrTimeFormat.specifiers.
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        locale_format.super_StrTimeFormat.specifiers.
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        locale_format.super_StrTimeFormat._vptr_StrTimeFormat =
             (_func_int **)&PTR__StrfTimeFormat_0279be10;
        locale_format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        locale_format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_offset = 0;
        locale_format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        locale_format.var_length_specifiers.
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        locale_format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        locale_format.var_length_specifiers.
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        locale_format.var_length_specifiers.
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        locale_format.is_date_specifier.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_offset = 0;
        ParseFormatSpecifier(&error,&subformat,&locale_format.super_StrTimeFormat);
        if (error._M_string_length != 0) {
          this = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_188,"Failed to bind sub-format specifier \"%s\": %s",
                     &local_211);
          ::std::__cxx11::string::string((string *)&local_50,(string *)&subformat);
          ::std::__cxx11::string::string((string *)&local_70,(string *)&error);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (this,&local_188,&local_50,&local_70);
          __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&locale_format.super_StrTimeFormat.literals,0);
        ::std::operator+(&local_188,&current_literal,pvVar7);
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&locale_format.super_StrTimeFormat.literals,0);
        ::std::__cxx11::string::operator=((string *)pvVar7,(string *)&local_188);
        ::std::__cxx11::string::~string((string *)&local_188);
        ::std::__cxx11::string::assign((char *)&current_literal);
        for (uVar10 = 0;
            uVar10 < (ulong)((long)locale_format.super_StrTimeFormat.specifiers.
                                   super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                   .
                                   super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)locale_format.super_StrTimeFormat.specifiers.
                                  super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                  .
                                  super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                  ._M_impl.super__Vector_impl_data._M_start); uVar10 = uVar10 + 1) {
          pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(&locale_format.super_StrTimeFormat.literals,uVar10);
          ::std::__cxx11::string::string(local_90,(string *)pvVar7);
          pvVar8 = vector<duckdb::StrTimeSpecifier,_true>::get<true>
                             (&locale_format.super_StrTimeFormat.specifiers,uVar10);
          (*format->_vptr_StrTimeFormat[2])(format,local_90,(ulong)*pvVar8);
          ::std::__cxx11::string::~string(local_90);
        }
        uVar10 = uVar12 + 2;
        ::std::__cxx11::string::~string((string *)&error);
        StrfTimeFormat::~StrfTimeFormat(&locale_format);
        ::std::__cxx11::string::~string((string *)&subformat);
        goto LAB_0155c73d;
      case 'U':
        bVar6 = 0x1b;
        break;
      case 'V':
        bVar6 = 0x23;
        break;
      case 'W':
        bVar6 = 0x1c;
        break;
      case 'Y':
        bVar6 = 0xb;
        break;
      case 'Z':
        bVar6 = 0x18;
        break;
      case 'a':
        bVar6 = 0;
        break;
      case 'b':
      case 'h':
        bVar6 = 5;
        break;
      case 'd':
        bVar6 = 3;
        break;
      case 'f':
        bVar6 = 0x15;
        break;
      case 'g':
        bVar6 = 0x16;
        break;
      case 'j':
        bVar6 = 0x19;
        break;
      case 'm':
        bVar6 = 7;
        break;
      case 'n':
        bVar6 = 0x20;
        break;
      case 'p':
        bVar6 = 0x10;
        break;
      case 'u':
        bVar6 = 0x22;
        break;
      case 'w':
        bVar6 = 2;
        break;
      case 'y':
        bVar6 = 9;
        break;
      case 'z':
        bVar6 = 0x17;
        break;
      default:
        uVar10 = uVar9;
        if (cVar1 != '%') {
          if ((cVar1 != '-') || (uVar9 = uVar12 + 2, format_string->_M_string_length <= uVar9))
          goto switchD_0155c38b_caseD_43;
          cVar1 = pcVar11[uVar9];
          if (cVar1 == 'H') {
            bVar6 = 0xd;
          }
          else if (cVar1 == 'I') {
            bVar6 = 0xf;
          }
          else if (cVar1 == 'M') {
            bVar6 = 0x12;
          }
          else if (cVar1 == 'S') {
            bVar6 = 0x14;
          }
          else if (cVar1 == 'd') {
            bVar6 = 4;
          }
          else if (cVar1 == 'j') {
            bVar6 = 0x1a;
          }
          else if (cVar1 == 'y') {
            bVar6 = 10;
          }
          else {
            if (cVar1 != 'm') {
              locale_format.super_StrTimeFormat._vptr_StrTimeFormat =
                   (_func_int **)
                   &locale_format.super_StrTimeFormat.format_specifier._M_string_length;
              ::std::__cxx11::string::_M_construct((ulong)&locale_format,'\x01');
              ::std::operator+(__return_storage_ptr__,
                               "Unrecognized format for strftime/strptime: %-",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &locale_format);
              goto LAB_0155c887;
            }
            bVar6 = 8;
          }
          break;
        }
        goto LAB_0155c73d;
      }
      local_1c8 = &local_1b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)current_literal._M_dataplus._M_p == &current_literal.field_2) {
        local_1b8._8_4_ = current_literal.field_2._8_4_;
        local_1b8._12_4_ = current_literal.field_2._12_4_;
      }
      else {
        local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)current_literal._M_dataplus._M_p;
      }
      local_1b8._M_allocated_capacity._4_4_ = current_literal.field_2._M_allocated_capacity._4_4_;
      local_1b8._M_allocated_capacity._0_4_ = current_literal.field_2._M_allocated_capacity._0_4_;
      current_literal._M_string_length = 0;
      local_1c0 = sVar5;
      current_literal.field_2._M_allocated_capacity._0_4_ =
           current_literal.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      current_literal._M_dataplus._M_p = (pointer)&current_literal.field_2;
      (*format->_vptr_StrTimeFormat[2])(format,(string *)&local_1c8,(ulong)bVar6);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::__cxx11::string::assign((char *)&current_literal);
      uVar10 = uVar9 + 1;
LAB_0155c73d:
      uVar12 = uVar9 + 1;
    }
    if (uVar10 < uVar4) {
      ::std::__cxx11::string::substr((ulong)&locale_format,(ulong)format_string);
      ::std::__cxx11::string::append((string *)&current_literal);
      ::std::__cxx11::string::~string((string *)&locale_format);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)current_literal._M_dataplus._M_p != &current_literal.field_2) {
      local_1a8._M_dataplus._M_p = current_literal._M_dataplus._M_p;
    }
    local_1a8.field_2._M_allocated_capacity._4_4_ =
         current_literal.field_2._M_allocated_capacity._4_4_;
    local_1a8.field_2._M_allocated_capacity._0_4_ =
         current_literal.field_2._M_allocated_capacity._0_4_;
    local_1a8._M_string_length = current_literal._M_string_length;
    current_literal._M_string_length = 0;
    current_literal.field_2._M_allocated_capacity._0_4_ =
         current_literal.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    current_literal._M_dataplus._M_p = (pointer)&current_literal.field_2;
    AddLiteral(format,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0155c82d:
    ::std::__cxx11::string::~string((string *)&current_literal);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrTimeFormat::ParseFormatSpecifier(const string &format_string, StrTimeFormat &format) {
	if (format_string.empty()) {
		return "Empty format string";
	}
	format.format_specifier = format_string;
	format.specifiers.clear();
	format.literals.clear();
	format.numeric_width.clear();
	format.constant_size = 0;
	idx_t pos = 0;
	string current_literal;
	for (idx_t i = 0; i < format_string.size(); i++) {
		if (format_string[i] == '%') {
			if (i + 1 == format_string.size()) {
				return "Trailing format character %";
			}
			if (i > pos) {
				// push the previous string to the current literal
				current_literal += format_string.substr(pos, i - pos);
			}
			char format_char = format_string[++i];
			if (format_char == '%') {
				// special case: %%
				// set the pos for the next literal and continue
				pos = i;
				continue;
			}
			StrTimeSpecifier specifier;
			if (format_char == '-' && i + 1 < format_string.size()) {
				format_char = format_string[++i];
				switch (format_char) {
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_DECIMAL;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_DECIMAL;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_DECIMAL;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_DECIMAL;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_DECIMAL;
					break;
				default:
					return "Unrecognized format for strftime/strptime: %-" + string(1, format_char);
				}
			} else {
				switch (format_char) {
				case 'a':
					specifier = StrTimeSpecifier::ABBREVIATED_WEEKDAY_NAME;
					break;
				case 'A':
					specifier = StrTimeSpecifier::FULL_WEEKDAY_NAME;
					break;
				case 'w':
					specifier = StrTimeSpecifier::WEEKDAY_DECIMAL;
					break;
				case 'u':
					specifier = StrTimeSpecifier::WEEKDAY_ISO;
					break;
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH_PADDED;
					break;
				case 'h':
				case 'b':
					specifier = StrTimeSpecifier::ABBREVIATED_MONTH_NAME;
					break;
				case 'B':
					specifier = StrTimeSpecifier::FULL_MONTH_NAME;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL_PADDED;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY_PADDED;
					break;
				case 'Y':
					specifier = StrTimeSpecifier::YEAR_DECIMAL;
					break;
				case 'G':
					specifier = StrTimeSpecifier::YEAR_ISO;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_PADDED;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_PADDED;
					break;
				case 'p':
					specifier = StrTimeSpecifier::AM_PM;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_PADDED;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_PADDED;
					break;
				case 'n':
					specifier = StrTimeSpecifier::NANOSECOND_PADDED;
					break;
				case 'f':
					specifier = StrTimeSpecifier::MICROSECOND_PADDED;
					break;
				case 'g':
					specifier = StrTimeSpecifier::MILLISECOND_PADDED;
					break;
				case 'z':
					specifier = StrTimeSpecifier::UTC_OFFSET;
					break;
				case 'Z':
					specifier = StrTimeSpecifier::TZ_NAME;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_PADDED;
					break;
				case 'U':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_SUN_FIRST;
					break;
				case 'W':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_MON_FIRST;
					break;
				case 'V':
					specifier = StrTimeSpecifier::WEEK_NUMBER_ISO;
					break;
				case 'c':
				case 'x':
				case 'X':
				case 'T': {
					string subformat;
					if (format_char == 'c') {
						// %c: Locale’s appropriate date and time representation.
						// we push the ISO timestamp representation here
						subformat = "%Y-%m-%d %H:%M:%S";
					} else if (format_char == 'x') {
						// %x - Locale’s appropriate date representation.
						// we push the ISO date format here
						subformat = "%Y-%m-%d";
					} else if (format_char == 'X' || format_char == 'T') {
						// %X - Locale’s appropriate time representation.
						// we push the ISO time format here
						subformat = "%H:%M:%S";
					}
					// parse the subformat in a separate format specifier
					StrfTimeFormat locale_format;
					string error = StrTimeFormat::ParseFormatSpecifier(subformat, locale_format);
					if (!error.empty()) {
						throw InternalException("Failed to bind sub-format specifier \"%s\": %s", subformat, error);
					}
					// add the previous literal to the first literal of the subformat
					locale_format.literals[0] = std::move(current_literal) + locale_format.literals[0];
					current_literal = "";
					// now push the subformat into the current format specifier
					for (idx_t i = 0; i < locale_format.specifiers.size(); i++) {
						format.AddFormatSpecifier(std::move(locale_format.literals[i]), locale_format.specifiers[i]);
					}
					pos = i + 1;
					continue;
				}
				default:
					return "Unrecognized format for strftime/strptime: %" + string(1, format_char);
				}
			}
			format.AddFormatSpecifier(std::move(current_literal), specifier);
			current_literal = "";
			pos = i + 1;
		}
	}
	// add the final literal
	if (pos < format_string.size()) {
		current_literal += format_string.substr(pos, format_string.size() - pos);
	}
	format.AddLiteral(std::move(current_literal));
	return string();
}